

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBlock
          (AsciiParser *this,Specifier spec,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          bool in_variantStaement)

{
  bool bVar1;
  ostream *poVar2;
  size_t offset;
  long primIdx_00;
  error_type *peVar3;
  ulong uVar4;
  size_type sVar5;
  mapped_type *__x;
  Specifier s;
  Specifier s_00;
  Specifier s_01;
  Specifier s_02;
  Path *__args_3;
  string local_2090;
  allocator local_2069;
  string local_2068 [32];
  fmt local_2048 [32];
  ostringstream local_2028 [8];
  ostringstream ss_w;
  string local_1eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e50;
  ostringstream local_1e30 [8];
  ostringstream ss_e_13;
  undefined1 local_1cb8 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_1;
  string local_1c88;
  undefined1 local_1c68 [8];
  Path pname_1;
  string local_1b90;
  string local_1b70;
  undefined1 local_1b50 [8];
  Path fullpath_1;
  mapped_type construct_fun;
  ostringstream local_1a40 [8];
  ostringstream ss_e_12;
  string local_18c8;
  allocator local_18a1;
  string local_18a0 [32];
  string local_1880;
  ostringstream local_1860 [8];
  ostringstream ss_e_11;
  undefined1 local_16e8 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string local_16b8;
  undefined1 local_1698 [8];
  Path pname;
  string local_15c0;
  string local_15a0;
  undefined1 local_1580 [8];
  Path fullpath;
  string pTy;
  ostringstream local_1470 [8];
  ostringstream ss_e_10;
  string local_12f8;
  string local_12d8;
  allocator local_12b1;
  string local_12b0 [32];
  fmt local_1290 [32];
  ostringstream local_1270 [8];
  ostringstream ss_e_9;
  int64_t idx;
  Specifier child_spec;
  string local_10d8;
  ostringstream local_10b8 [8];
  ostringstream ss_e_8;
  undefined1 local_f40 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  vmap;
  ostringstream local_ef0 [8];
  ostringstream ss_e_7;
  undefined1 local_d78 [8];
  string variantName;
  ostringstream local_d38 [8];
  ostringstream ss_e_6;
  string local_bc0;
  ostringstream local_ba0 [8];
  ostringstream ss_e_5;
  undefined1 local_a28 [8];
  Identifier tok;
  string local_a00 [7];
  char c_2;
  undefined1 local_9e0 [8];
  string full_path;
  VariantSetList variantSetList;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> propNames;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  props;
  undefined1 local_940 [7];
  char c_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  in_metas;
  ostringstream local_8f0 [8];
  ostringstream ss_e_4;
  undefined1 local_778 [8];
  string prim_name;
  Identifier prim_type;
  undefined1 local_730 [6];
  char c;
  bool has_primtype;
  string local_710;
  ostringstream local_6f0 [8];
  ostringstream ss_e_3;
  string local_578;
  string local_558;
  ostringstream local_538 [8];
  ostringstream ss_e_2;
  string local_3c0;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream ss_e_1;
  string local_208;
  ostringstream local_1e8 [8];
  ostringstream ss_e;
  int local_6c;
  undefined1 local_68 [8];
  Identifier def;
  bool in_variantStaement_local;
  uint32_t depth_local;
  int64_t parentPrimIdx_local;
  int64_t primIdx_local;
  Specifier spec_local;
  AsciiParser *this_local;
  
  def.super_string.field_2._M_local_buf[0xb] = in_variantStaement;
  def.super_string.field_2._12_4_ = depth;
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_006345fc;
  }
  Identifier::Identifier((Identifier *)local_68);
  bVar1 = ReadIdentifier(this,(string *)local_68);
  if (bVar1) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"def");
    if (((bVar1) ||
        (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68,"over"), bVar1)) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,"class"), bVar1)) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"def");
      if (bVar1) {
        if (spec == Def) goto LAB_00632eb5;
        ::std::__cxx11::ostringstream::ostringstream(local_380);
        poVar2 = ::std::operator<<((ostream *)local_380,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[ASCII]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseBlock");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12db);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_380,
                                   "Internal error. Invalid Specifier token combination. def = ");
        poVar2 = ::std::operator<<(poVar2,(string *)local_68);
        poVar2 = ::std::operator<<(poVar2,", spec = ");
        tinyusdz::to_string_abi_cxx11_(&local_3a0,(tinyusdz *)(ulong)spec,s);
        poVar2 = ::std::operator<<(poVar2,(string *)&local_3a0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)&local_3a0);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_3c0);
        ::std::__cxx11::string::~string((string *)&local_3c0);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_380);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_68,"over");
        if (bVar1) {
          if (spec == Over) goto LAB_00632eb5;
          ::std::__cxx11::ostringstream::ostringstream(local_538);
          poVar2 = ::std::operator<<((ostream *)local_538,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParseBlock");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12e1);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_538,
                                     "Internal error. Invalid Specifier token combination. def = ");
          poVar2 = ::std::operator<<(poVar2,(string *)local_68);
          poVar2 = ::std::operator<<(poVar2,", spec = ");
          tinyusdz::to_string_abi_cxx11_(&local_558,(tinyusdz *)(ulong)spec,s_00);
          poVar2 = ::std::operator<<(poVar2,(string *)&local_558);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)&local_558);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_578);
          ::std::__cxx11::string::~string((string *)&local_578);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_538);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68,"class");
          if ((bVar1) && (spec != Class)) {
            ::std::__cxx11::ostringstream::ostringstream(local_6f0);
            poVar2 = ::std::operator<<((ostream *)local_6f0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[ASCII]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ParseBlock");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12e7);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_6f0,
                                       "Internal error. Invalid Specifier token combination. def = "
                                      );
            poVar2 = ::std::operator<<(poVar2,(string *)local_68);
            poVar2 = ::std::operator<<(poVar2,", spec = ");
            tinyusdz::to_string_abi_cxx11_(&local_710,(tinyusdz *)(ulong)spec,s_01);
            poVar2 = ::std::operator<<(poVar2,(string *)&local_710);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)&local_710);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)local_730);
            ::std::__cxx11::string::~string((string *)local_730);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_6f0);
          }
          else {
LAB_00632eb5:
            bVar1 = SkipWhitespaceAndNewline(this,true);
            if (bVar1) {
              prim_type.super_string.field_2._M_local_buf[0xf] = '\0';
              bVar1 = Char1(this,prim_type.super_string.field_2._M_local_buf + 0xe);
              if (bVar1) {
                bVar1 = Rewind(this,1);
                if (bVar1) {
                  prim_type.super_string.field_2._M_local_buf[0xf] =
                       prim_type.super_string.field_2._M_local_buf[0xe] != '\"';
                  Identifier::Identifier((Identifier *)((long)&prim_name.field_2 + 8));
                  if (((prim_type.super_string.field_2._M_local_buf[0xf] & 1U) == 0) ||
                     (bVar1 = ReadIdentifier(this,(string *)((long)&prim_name.field_2 + 8)), bVar1))
                  {
                    bVar1 = SkipWhitespaceAndNewline(this,true);
                    if (bVar1) {
                      ::std::__cxx11::string::string((string *)local_778);
                      bVar1 = ReadBasicType(this,(string *)local_778);
                      if (bVar1) {
                        bVar1 = ValidatePrimElementName((string *)local_778);
                        if (bVar1) {
                          bVar1 = SkipWhitespaceAndNewline(this,true);
                          if (bVar1) {
                            ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                   *)local_940);
                            bVar1 = LookChar1(this,(char *)((long)&props._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count + 7));
                            if (bVar1) {
                              if (props._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ ==
                                  '(') {
                                bVar1 = ParsePrimMetas(this,(PrimMetaMap *)local_940);
                                if (bVar1) {
                                  bVar1 = SkipWhitespaceAndNewline(this,true);
                                  if (bVar1) goto LAB_0063319d;
                                  this_local._7_1_ = 0;
                                }
                                else {
                                  this_local._7_1_ = 0;
                                }
                              }
                              else {
LAB_0063319d:
                                bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                                if (bVar1) {
                                  bVar1 = Expect(this,'{');
                                  if (bVar1) {
                                    bVar1 = SkipWhitespaceAndNewline(this,true);
                                    if (bVar1) {
                                      ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                             *)&propNames.
                                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                      ::std::
                                      vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                      vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                              *)&variantSetList._M_t._M_impl.super__Rb_tree_header.
                                                 _M_node_count);
                                      ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                             *)((long)&full_path.field_2 + 8));
                                      GetCurrentPrimPath_abi_cxx11_((string *)local_9e0,this);
                                      bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_9e0,"/");
                                      if (bVar1) {
                                        ::std::__cxx11::string::operator+=
                                                  ((string *)local_9e0,(string *)local_778);
                                      }
                                      else {
                                        ::std::operator+((char *)local_a00,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x9de871);
                                        ::std::__cxx11::string::operator+=
                                                  ((string *)local_9e0,local_a00);
                                        ::std::__cxx11::string::~string(local_a00);
                                      }
                                      PushPrimPath(this,(string *)local_9e0);
                                      ::std::__cxx11::string::~string((string *)local_9e0);
                                      do {
                                        bVar1 = Eof(this);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00633c7b:
                                          ::std::__cxx11::string::string
                                                    ((string *)&fullpath._valid,
                                                     (string *)(prim_name.field_2._M_local_buf + 8))
                                          ;
                                          if ((this->_primspec_mode & 1U) == 0) {
                                            uVar4 = ::std::__cxx11::string::empty();
                                            if ((uVar4 & 1) != 0) {
                                              ::std::__cxx11::string::operator=
                                                        ((string *)&fullpath._valid,"Model");
                                            }
                                            sVar5 = ::std::map<$40cfd1d7$>::count
                                                              (&this->_prim_construct_fun_map,
                                                               (key_type_conflict *)&fullpath._valid
                                                              );
                                            if ((sVar5 == 0) &&
                                               (((this->_option).allow_unknown_prim & 1U) != 0)) {
                                              ::std::__cxx11::string::operator=
                                                        ((string *)&fullpath._valid,"Model");
                                            }
                                            sVar5 = ::std::map<$40cfd1d7$>::count
                                                              (&this->_prim_construct_fun_map,
                                                               (key_type_conflict *)&fullpath._valid
                                                              );
                                            if (sVar5 == 0) {
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (local_2028);
                                              poVar2 = ::std::operator<<((ostream *)local_2028,
                                                                         "[warn]");
                                              poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                              poVar2 = ::std::operator<<(poVar2,":");
                                              poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                              poVar2 = ::std::operator<<(poVar2,"():");
                                              poVar2 = (ostream *)
                                                       ::std::ostream::operator<<(poVar2,0x13f7);
                                              ::std::operator<<(poVar2," ");
                                              ::std::allocator<char>::allocator();
                                              ::std::__cxx11::string::string
                                                        (local_2068,
                                                                                                                  
                                                  "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing."
                                                  ,&local_2069);
                                              fmt::format<std::__cxx11::string>
                                                        (local_2048,(string *)local_2068,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&fullpath._valid);
                                              poVar2 = ::std::operator<<((ostream *)local_2028,
                                                                         (string *)local_2048);
                                              ::std::operator<<(poVar2,"\n");
                                              ::std::__cxx11::string::~string((string *)local_2048);
                                              ::std::__cxx11::string::~string(local_2068);
                                              ::std::allocator<char>::~allocator
                                                        ((allocator<char> *)&local_2069);
                                              ::std::__cxx11::ostringstream::str();
                                              PushWarn(this,&local_2090);
                                              ::std::__cxx11::string::~string((string *)&local_2090)
                                              ;
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (local_2028);
                                            }
                                            else {
                                              __x = ::std::map<$40cfd1d7$>::operator[]
                                                              (&this->_prim_construct_fun_map,
                                                               (key_type *)&fullpath._valid);
                                              ::std::function<$3792144$>::function
                                                        ((function<_3792144_> *)&fullpath_1._valid,
                                                         __x);
                                              GetCurrentPrimPath_abi_cxx11_(&local_1b70,this);
                                              ::std::allocator<char>::allocator();
                                              ::std::__cxx11::string::string
                                                        ((string *)&local_1b90,"",
                                                         (allocator *)&pname_1.field_0xcf);
                                              Path::Path((Path *)local_1b50,&local_1b70,&local_1b90)
                                              ;
                                              ::std::__cxx11::string::~string((string *)&local_1b90)
                                              ;
                                              ::std::allocator<char>::~allocator
                                                        ((allocator<char> *)&pname_1.field_0xcf);
                                              ::std::__cxx11::string::~string((string *)&local_1b70)
                                              ;
                                              ::std::allocator<char>::allocator();
                                              ::std::__cxx11::string::string
                                                        ((string *)&local_1c88,"",
                                                         (allocator *)
                                                         &ret_1.contained.
                                                                                                                    
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0x27);
                                              Path::Path((Path *)local_1c68,(string *)local_778,
                                                         &local_1c88);
                                              ::std::__cxx11::string::~string((string *)&local_1c88)
                                              ;
                                              ::std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         &ret_1.contained.
                                                                                                                    
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0x27);
                                              ::std::function<$3792144$>::operator()
                                                        ((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1cb8,
                                                  (function<_3792144_> *)&fullpath_1._valid,
                                                  (Path *)local_1b50,spec,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prim_name.field_2 + 8),
                                                  (Path *)local_1c68,primIdx,parentPrimIdx,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)&propNames.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                                  *)local_940,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                                  *)((long)&full_path.field_2 + 8));
                                              bVar1 = nonstd::expected_lite::expected::
                                                      operator_cast_to_bool((expected *)local_1cb8);
                                              if (!bVar1) {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_1e30);
                                                poVar2 = ::std::operator<<((ostream *)local_1e30,
                                                                           "[error]");
                                                poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar2 = ::std::operator<<(poVar2,":");
                                                poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                poVar2 = ::std::operator<<(poVar2,"():");
                                                poVar2 = (ostream *)
                                                         ::std::ostream::operator<<(poVar2,0x13f1);
                                                ::std::operator<<(poVar2," ");
                                                ::std::operator+((char *)&local_1e90,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Constructing Prim type `");
                                                ::std::operator+(&local_1e70,&local_1e90,
                                                                 "` failed: ");
                                                peVar3 = nonstd::expected_lite::
                                                                                                                  
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::error((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1cb8);
                                                ::std::operator+(&local_1e50,&local_1e70,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)peVar3);
                                                poVar2 = ::std::operator<<((ostream *)local_1e30,
                                                                           (string *)&local_1e50);
                                                ::std::operator<<(poVar2,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1e50);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1e70);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1e90);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,&local_1eb0);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1eb0);
                                                this_local._7_1_ = 0;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_1e30);
                                              }
                                              nonstd::expected_lite::
                                              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~expected((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1cb8);
                                              Path::~Path((Path *)local_1c68);
                                              Path::~Path((Path *)local_1b50);
                                              ::std::function<$3792144$>::~function
                                                        ((function<_3792144_> *)&fullpath_1._valid);
                                              if (!bVar1) goto LAB_0063459f;
                                            }
LAB_00634588:
                                            PopPrimPath(this);
                                            this_local._7_1_ = 1;
                                          }
                                          else {
                                            bVar1 = ::std::function::operator_cast_to_bool
                                                              ((function *)&this->_primspec_fun);
                                            if (bVar1) {
                                              GetCurrentPrimPath_abi_cxx11_(&local_15a0,this);
                                              ::std::allocator<char>::allocator();
                                              ::std::__cxx11::string::string
                                                        ((string *)&local_15c0,"",
                                                         (allocator *)&pname.field_0xcf);
                                              Path::Path((Path *)local_1580,&local_15a0,&local_15c0)
                                              ;
                                              ::std::__cxx11::string::~string((string *)&local_15c0)
                                              ;
                                              ::std::allocator<char>::~allocator
                                                        ((allocator<char> *)&pname.field_0xcf);
                                              ::std::__cxx11::string::~string((string *)&local_15a0)
                                              ;
                                              ::std::allocator<char>::allocator();
                                              ::std::__cxx11::string::string
                                                        ((string *)&local_16b8,"",
                                                         (allocator *)
                                                         &ret.contained.
                                                                                                                    
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0x27);
                                              Path::Path((Path *)local_1698,(string *)local_778,
                                                         &local_16b8);
                                              ::std::__cxx11::string::~string((string *)&local_16b8)
                                              ;
                                              ::std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         &ret.contained.
                                                                                                                    
                                                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .field_0x27);
                                              __args_3 = (Path *)local_1698;
                                              ::std::function<$3792144$>::operator()
                                                        ((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_16e8,&this->_primspec_fun,
                                                  (Path *)local_1580,spec,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&prim_name.field_2 + 8),__args_3,primIdx,
                                                  parentPrimIdx,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)&propNames.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                                  *)local_940,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                                  *)((long)&full_path.field_2 + 8));
                                              bVar1 = nonstd::expected_lite::expected::
                                                      operator_cast_to_bool((expected *)local_16e8);
                                              if (!bVar1) {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_1860);
                                                poVar2 = ::std::operator<<((ostream *)local_1860,
                                                                           "[error]");
                                                poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar2 = ::std::operator<<(poVar2,":");
                                                poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                poVar2 = ::std::operator<<(poVar2,"():");
                                                poVar2 = (ostream *)
                                                         ::std::ostream::operator<<(poVar2,0x13cd);
                                                ::std::operator<<(poVar2," ");
                                                ::std::allocator<char>::allocator();
                                                ::std::__cxx11::string::string
                                                          (local_18a0,
                                                                                                                      
                                                  "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}"
                                                  ,&local_18a1);
                                                peVar3 = nonstd::expected_lite::
                                                                                                                  
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::error((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_16e8);
                                                fmt::
                                                format<tinyusdz::ascii::Identifier,std::__cxx11::string,std::__cxx11::string>
                                                          (&local_1880,(fmt *)local_18a0,
                                                           (string *)((long)&prim_name.field_2 + 8),
                                                           (Identifier *)local_778,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)peVar3,&__args_3->_prim_part);
                                                poVar2 = ::std::operator<<((ostream *)local_1860,
                                                                           (string *)&local_1880);
                                                ::std::operator<<(poVar2,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_1880);
                                                ::std::__cxx11::string::~string(local_18a0);
                                                ::std::allocator<char>::~allocator
                                                          ((allocator<char> *)&local_18a1);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,&local_18c8);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_18c8);
                                                this_local._7_1_ = 0;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_1860);
                                              }
                                              nonstd::expected_lite::
                                              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~expected((
                                                  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_16e8);
                                              Path::~Path((Path *)local_1698);
                                              Path::~Path((Path *)local_1580);
                                              if (bVar1) goto LAB_00634588;
                                            }
                                            else {
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (local_1a40);
                                              poVar2 = ::std::operator<<((ostream *)local_1a40,
                                                                         "[error]");
                                              poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                              poVar2 = ::std::operator<<(poVar2,"[ASCII]");
                                              poVar2 = ::std::operator<<(poVar2,":");
                                              poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                              poVar2 = ::std::operator<<(poVar2,"():");
                                              poVar2 = (ostream *)
                                                       ::std::ostream::operator<<(poVar2,0x13d1);
                                              ::std::operator<<(poVar2," ");
                                              poVar2 = ::std::operator<<((ostream *)local_1a40,
                                                                                                                                                  
                                                  "[Internal Error] PrimSpec handler is not found.")
                                              ;
                                              ::std::operator<<(poVar2,"\n");
                                              ::std::__cxx11::ostringstream::str();
                                              PushError(this,(string *)&construct_fun._M_invoker);
                                              ::std::__cxx11::string::~string
                                                        ((string *)&construct_fun._M_invoker);
                                              this_local._7_1_ = 0;
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (local_1a40);
                                            }
                                          }
LAB_0063459f:
                                          ::std::__cxx11::string::~string
                                                    ((string *)&fullpath._valid);
                                          break;
                                        }
                                        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
                                        if (!bVar1) {
                                          this_local._7_1_ = 0;
                                          break;
                                        }
                                        bVar1 = Char1(this,tok.super_string.field_2._M_local_buf +
                                                           0xf);
                                        if (!bVar1) {
                                          this_local._7_1_ = 0;
                                          break;
                                        }
                                        if (tok.super_string.field_2._M_local_buf[0xf] == '}')
                                        goto LAB_00633c7b;
                                        bVar1 = Rewind(this,1);
                                        if (!bVar1) {
                                          this_local._7_1_ = 0;
                                          break;
                                        }
                                        Identifier::Identifier((Identifier *)local_a28);
                                        bVar1 = ReadBasicType(this,(Identifier *)local_a28);
                                        if (bVar1) {
                                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a28,"variantSet");
                                          if (bVar1) {
                                            bVar1 = SkipWhitespace(this);
                                            if (bVar1) {
                                              ::std::__cxx11::string::string((string *)local_d78);
                                              bVar1 = ReadBasicType(this,(string *)local_d78);
                                              if (bVar1) {
                                                bVar1 = SkipWhitespace(this);
                                                if (bVar1) {
                                                  bVar1 = Expect(this,'=');
                                                  if (bVar1) {
                                                    bVar1 = SkipWhitespace(this);
                                                    if (bVar1) {
                                                      ::std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  ::map((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  *)local_f40);
                                                  bVar1 = ParseVariantSet(this,primIdx,parentPrimIdx
                                                                          ,def.super_string.field_2.
                                                                           _12_4_,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  *)local_f40);
                                                  if (bVar1) {
                                                    ::std::
                                                  map<std::__cxx11::string,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                                  ::
                                                  emplace<std::__cxx11::string&,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>&>
                                                            ((
                                                  map<std::__cxx11::string,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                                  *)(full_path.field_2._M_local_buf + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_d78,
                                                  (
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  *)local_f40);
                                                  local_6c = 0xc;
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_10b8);
                                                    poVar2 = ::std::operator<<((ostream *)local_10b8
                                                                               ,"[error]");
                                                    poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                  poVar2 = ::std::operator<<(poVar2,":");
                                                  poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                  poVar2 = ::std::operator<<(poVar2,"():");
                                                  poVar2 = (ostream *)
                                                           ::std::ostream::operator<<(poVar2,0x138e)
                                                  ;
                                                  ::std::operator<<(poVar2," ");
                                                  poVar2 = ::std::operator<<((ostream *)local_10b8,
                                                                                                                                                          
                                                  "Failed to parse `variantSet` statement.");
                                                  ::std::operator<<(poVar2,"\n");
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_10d8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_10d8);
                                                  this_local._7_1_ = 0;
                                                  local_6c = 1;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_10b8);
                                                  }
                                                  ::std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  ::~map((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                                  *)local_f40);
                                                  }
                                                  else {
                                                    this_local._7_1_ = 0;
                                                    local_6c = 1;
                                                  }
                                                  }
                                                  else {
                                                    this_local._7_1_ = 0;
                                                    local_6c = 1;
                                                  }
                                                }
                                                else {
                                                  this_local._7_1_ = 0;
                                                  local_6c = 1;
                                                }
                                              }
                                              else {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_ef0);
                                                poVar2 = ::std::operator<<((ostream *)local_ef0,
                                                                           "[error]");
                                                poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar2 = ::std::operator<<(poVar2,":");
                                                poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                poVar2 = ::std::operator<<(poVar2,"():");
                                                poVar2 = (ostream *)
                                                         ::std::ostream::operator<<(poVar2,0x137b);
                                                ::std::operator<<(poVar2," ");
                                                poVar2 = ::std::operator<<((ostream *)local_ef0,
                                                                                                                                                      
                                                  "Failed to parse `variantSet` statement.");
                                                ::std::operator<<(poVar2,"\n");
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,(string *)
                                                               &vmap._M_t._M_impl.
                                                                super__Rb_tree_header._M_node_count)
                                                ;
                                                ::std::__cxx11::string::~string
                                                          ((string *)
                                                           &vmap._M_t._M_impl.super__Rb_tree_header.
                                                            _M_node_count);
                                                this_local._7_1_ = 0;
                                                local_6c = 1;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_ef0);
                                              }
                                              ::std::__cxx11::string::~string((string *)local_d78);
                                            }
                                            else {
                                              this_local._7_1_ = 0;
                                              local_6c = 1;
                                            }
                                          }
                                          else {
                                            offset = ::std::__cxx11::string::size();
                                            bVar1 = Rewind(this,offset);
                                            if (bVar1) {
                                              idx._4_4_ = Invalid;
                                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a28,"def");
                                              if (bVar1) {
                                                idx._4_4_ = Def;
                                              }
                                              else {
                                                bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a28,"over");
                                                if (bVar1) {
                                                  idx._4_4_ = Over;
                                                }
                                                else {
                                                  bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a28,"class");
                                                  if (bVar1) {
                                                    idx._4_4_ = Class;
                                                  }
                                                }
                                              }
                                              if (idx._4_4_ == Invalid) {
                                                bVar1 = ParsePrimProps(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)&propNames.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  *)&variantSetList._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count);
                                                if (bVar1) goto LAB_00633c1c;
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_1470);
                                                poVar2 = ::std::operator<<((ostream *)local_1470,
                                                                           "[error]");
                                                poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                poVar2 = ::std::operator<<(poVar2,":");
                                                poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                poVar2 = ::std::operator<<(poVar2,"():");
                                                poVar2 = (ostream *)
                                                         ::std::ostream::operator<<(poVar2,0x13b2);
                                                ::std::operator<<(poVar2," ");
                                                poVar2 = ::std::operator<<((ostream *)local_1470,
                                                                                                                                                      
                                                  "Failed to parse Prim attribute.");
                                                ::std::operator<<(poVar2,"\n");
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,(string *)((long)&pTy.field_2 + 8));
                                                ::std::__cxx11::string::~string
                                                          ((string *)(pTy.field_2._M_local_buf + 8))
                                                ;
                                                this_local._7_1_ = 0;
                                                local_6c = 1;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_1470);
                                              }
                                              else {
                                                primIdx_00 = ::std::function<long_(long)>::
                                                             operator()(&this->_prim_idx_assign_fun,
                                                                        parentPrimIdx);
                                                bVar1 = ParseBlock(this,idx._4_4_,primIdx_00,primIdx
                                                                   ,def.super_string.field_2._12_4_
                                                                    + 1,false);
                                                if (bVar1) {
LAB_00633c1c:
                                                  bVar1 = SkipWhitespaceAndNewline(this,true);
                                                  if (bVar1) {
                                                    local_6c = 0;
                                                  }
                                                  else {
                                                    this_local._7_1_ = 0;
                                                    local_6c = 1;
                                                  }
                                                }
                                                else {
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            (local_1270);
                                                  poVar2 = ::std::operator<<((ostream *)local_1270,
                                                                             "[error]");
                                                  poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                                  poVar2 = ::std::operator<<(poVar2,":");
                                                  poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                                  poVar2 = ::std::operator<<(poVar2,"():");
                                                  poVar2 = (ostream *)
                                                           ::std::ostream::operator<<(poVar2,0x13ab)
                                                  ;
                                                  ::std::operator<<(poVar2," ");
                                                  ::std::allocator<char>::allocator();
                                                  ::std::__cxx11::string::string
                                                            (local_12b0,"`{}` block parse failed.",
                                                             &local_12b1);
                                                  tinyusdz::to_string_abi_cxx11_
                                                            (&local_12d8,
                                                             (tinyusdz *)(ulong)idx._4_4_,s_02);
                                                  fmt::format<std::__cxx11::string>
                                                            (local_1290,(string *)local_12b0,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_12d8);
                                                  poVar2 = ::std::operator<<((ostream *)local_1270,
                                                                             (string *)local_1290);
                                                  ::std::operator<<(poVar2,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_1290);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_12d8);
                                                  ::std::__cxx11::string::~string(local_12b0);
                                                  ::std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_12b1);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_12f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_12f8);
                                                  this_local._7_1_ = 0;
                                                  local_6c = 1;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_1270);
                                                }
                                              }
                                            }
                                            else {
                                              this_local._7_1_ = 0;
                                              local_6c = 1;
                                            }
                                          }
                                        }
                                        else {
                                          bVar1 = LookChar1(this,tok.super_string.field_2.
                                                                 _M_local_buf + 0xf);
                                          if ((bVar1) &&
                                             (tok.super_string.field_2._M_local_buf[0xf] == ';')) {
                                            ::std::__cxx11::ostringstream::ostringstream(local_ba0);
                                            poVar2 = ::std::operator<<((ostream *)local_ba0,
                                                                       "[error]");
                                            poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                            poVar2 = ::std::operator<<(poVar2,":");
                                            poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                            poVar2 = ::std::operator<<(poVar2,"():");
                                            poVar2 = (ostream *)
                                                     ::std::ostream::operator<<(poVar2,0x136d);
                                            ::std::operator<<(poVar2," ");
                                            poVar2 = ::std::operator<<((ostream *)local_ba0,
                                                                                                                                              
                                                  "Semicolon is not allowd in `def` block statement."
                                                  );
                                            ::std::operator<<(poVar2,"\n");
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,&local_bc0);
                                            ::std::__cxx11::string::~string((string *)&local_bc0);
                                            this_local._7_1_ = 0;
                                            local_6c = 1;
                                            ::std::__cxx11::ostringstream::~ostringstream(local_ba0)
                                            ;
                                          }
                                          else {
                                            ::std::__cxx11::ostringstream::ostringstream(local_d38);
                                            poVar2 = ::std::operator<<((ostream *)local_d38,
                                                                       "[error]");
                                            poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                                            poVar2 = ::std::operator<<(poVar2,":");
                                            poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                                            poVar2 = ::std::operator<<(poVar2,"():");
                                            poVar2 = (ostream *)
                                                     ::std::ostream::operator<<(poVar2,0x1371);
                                            ::std::operator<<(poVar2," ");
                                            poVar2 = ::std::operator<<((ostream *)local_d38,
                                                                                                                                              
                                                  "Failed to parse an identifier in `def` block statement."
                                                  );
                                            ::std::operator<<(poVar2,"\n");
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,(string *)
                                                           ((long)&variantName.field_2 + 8));
                                            ::std::__cxx11::string::~string
                                                      ((string *)
                                                       (variantName.field_2._M_local_buf + 8));
                                            this_local._7_1_ = 0;
                                            local_6c = 1;
                                            ::std::__cxx11::ostringstream::~ostringstream(local_d38)
                                            ;
                                          }
                                        }
                                        Identifier::~Identifier((Identifier *)local_a28);
                                      } while ((local_6c == 0) || (local_6c == 0xc));
                                      ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                                              *)((long)&full_path.field_2 + 8));
                                      ::std::
                                      vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                      ~vector((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               *)&variantSetList._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count);
                                      ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                              *)&propNames.
                                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                      ;
                                    }
                                    else {
                                      this_local._7_1_ = 0;
                                    }
                                  }
                                  else {
                                    this_local._7_1_ = 0;
                                  }
                                }
                                else {
                                  this_local._7_1_ = 0;
                                }
                              }
                            }
                            else {
                              this_local._7_1_ = 0;
                            }
                            ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                                    *)local_940);
                          }
                          else {
                            this_local._7_1_ = 0;
                          }
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_8f0);
                          poVar2 = ::std::operator<<((ostream *)local_8f0,"[error]");
                          poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  );
                          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
                          poVar2 = ::std::operator<<(poVar2,":");
                          poVar2 = ::std::operator<<(poVar2,"ParseBlock");
                          poVar2 = ::std::operator<<(poVar2,"():");
                          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1318);
                          ::std::operator<<(poVar2," ");
                          poVar2 = ::std::operator<<((ostream *)local_8f0,
                                                     "Prim name contains invalid chacracter.");
                          ::std::operator<<(poVar2,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)
                                         &in_metas._M_t._M_impl.super__Rb_tree_header._M_node_count)
                          ;
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     &in_metas._M_t._M_impl.super__Rb_tree_header._M_node_count);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_8f0);
                        }
                      }
                      else {
                        this_local._7_1_ = 0;
                      }
                      ::std::__cxx11::string::~string((string *)local_778);
                    }
                    else {
                      this_local._7_1_ = 0;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                  Identifier::~Identifier((Identifier *)((long)&prim_name.field_2 + 8));
                }
                else {
                  this_local._7_1_ = 0;
                }
              }
              else {
                this_local._7_1_ = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
            }
          }
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar2 = ::std::operator<<((ostream *)local_1e8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseBlock");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12d3);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1e8,"Invalid specifier.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_208);
      ::std::__cxx11::string::~string((string *)&local_208);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1e8);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  Identifier::~Identifier((Identifier *)local_68);
LAB_006345fc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseBlock(const Specifier spec, const int64_t primIdx,
                             const int64_t parentPrimIdx, const uint32_t depth,
                             const bool in_variantStaement) {
  (void)in_variantStaement;

  DCOUT("ParseBlock");

  if (!SkipCommentAndWhitespaceAndNewline()) {
    DCOUT("SkipCommentAndWhitespaceAndNewline failed");
    return false;
  }

  Identifier def;
  if (!ReadIdentifier(&def)) {
    DCOUT("ReadIdentifier failed");
    return false;
  }
  DCOUT("spec = " << def);

  if ((def == "def") || (def == "over") || (def == "class")) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN("Invalid specifier.");
  }

  // Ensure spec and def is same.
  if (def == "def") {
    if (spec != Specifier::Def) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "over") {
    if (spec != Specifier::Over) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "class") {
    if (spec != Specifier::Class) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // look ahead
  bool has_primtype = false;
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (!Rewind(1)) {
      return false;
    }

    if (c == '"') {
      // token
      has_primtype = false;
    } else {
      has_primtype = true;
    }
  }

  Identifier prim_type;

  DCOUT("has_primtype = " << has_primtype);

  if (has_primtype) {
    if (!ReadIdentifier(&prim_type)) {
      return false;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string prim_name;
  if (!ReadBasicType(&prim_name)) {
    return false;
  }

  DCOUT("prim name = " << prim_name);
  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Prim name contains invalid chacracter.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, std::pair<ListEditQual, MetaVariable>> in_metas;
  {
    // look ahead
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // meta

      if (!ParsePrimMetas(&in_metas)) {
        DCOUT("Parse Prim metas failed.");
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, Property> props;
  std::vector<value::token> propNames;
  VariantSetList variantSetList;

  {
    std::string full_path = GetCurrentPrimPath();
    if (full_path == "/") {
      full_path += prim_name;
    } else {
      full_path += "/" + prim_name;
    }
    PushPrimPath(full_path);
  }

  // expect = '}'
  //        | def_block
  //        | prim_attr+
  //        | variantSet '{' ... '}'
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      // end block
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read stmt token");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        // maybe ';'?

        if (LookChar1(&c)) {
          if (c == ';') {
            PUSH_ERROR_AND_RETURN(
                "Semicolon is not allowd in `def` block statement.");
          }
        }
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in `def` block statement.");
      }

      if (tok == "variantSet") {
        if (!SkipWhitespace()) {
          return false;
        }

        std::string variantName;
        if (!ReadBasicType(&variantName)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        DCOUT("variantName = " << variantName);

        if (!SkipWhitespace()) {
          return false;
        }

        if (!Expect('=')) {
          return false;
        }

        if (!SkipWhitespace()) {
          return false;
        }

        std::map<std::string, VariantContent> vmap;
        if (!ParseVariantSet(primIdx, parentPrimIdx, depth, &vmap)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        variantSetList.emplace(variantName, vmap);

        continue;
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      if (child_spec != Specifier::Invalid) {
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseDef. spec = " << to_string(child_spec) << ", idx = "
                                        << idx << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));
      } else {
        DCOUT("Enter ParsePrimProps.");
        // Assume PrimAttr
        if (!ParsePrimProps(&props, &propNames)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  std::string pTy = prim_type;

  if (_primspec_mode) {
    // Load scene as PrimSpec tree
    if (_primspec_fun) {
      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");

      // pass prim_type as is(empty = empty string)
      nonstd::expected<bool, std::string> ret =
          _primspec_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
            prim_type, prim_name, ret.error()));
      }
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "[Internal Error] PrimSpec handler is not found.");
    }

  } else {
    // Create typed Prim.

    if (prim_type.empty()) {
      // No Prim type specified. Treat it as Model

      pTy = "Model";
    }

    if (!_prim_construct_fun_map.count(pTy)) {
      if (_option.allow_unknown_prim) {
        // Unknown Prim type specified. Treat it as Model
        // Prim's type name will be storead in Model::prim_type_name
        pTy = "Model";
      }
    }

    if (_prim_construct_fun_map.count(pTy)) {
      auto construct_fun = _prim_construct_fun_map[pTy];

      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");
      nonstd::expected<bool, std::string> ret =
          construct_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN("Constructing Prim type `" + pTy +
                              "` failed: " + ret.error());
      }

    } else {
      PUSH_WARN(fmt::format(
          "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing.",
          pTy));
    }
  }

  PopPrimPath();

  return true;
}